

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

target_ulong helper_fclass_d_riscv64(uint64_t frs1)

{
  int iVar1;
  ulong uVar2;
  float_status fVar3;
  float64 f;
  float_status s;
  
  uVar2 = frs1 & 0x7fffffffffffffff;
  if (uVar2 == 0) {
    return (ulong)(-1 < (long)frs1) * 8 + 8;
  }
  if (uVar2 == 0x7ff0000000000000) {
    fVar3.float_detect_tininess = -0x80;
    fVar3.float_rounding_mode = '\0';
    fVar3.float_exception_flags = '\0';
    fVar3.floatx80_rounding_precision = '\0';
    fVar3.flush_to_zero = '\0';
    fVar3.flush_inputs_to_zero = '\0';
    fVar3.default_nan_mode = '\0';
    fVar3.snan_bit_is_one = '\0';
    s.float_detect_tininess = '\x01';
    s.float_rounding_mode = '\0';
    s.float_exception_flags = '\0';
    s.floatx80_rounding_precision = '\0';
    s.flush_to_zero = '\0';
    s.flush_inputs_to_zero = '\0';
    s.default_nan_mode = '\0';
    s.snan_bit_is_one = '\0';
  }
  else if ((frs1 & 0x7ff0000000000000) == 0) {
    fVar3.float_detect_tininess = ' ';
    fVar3.float_rounding_mode = '\0';
    fVar3.float_exception_flags = '\0';
    fVar3.floatx80_rounding_precision = '\0';
    fVar3.flush_to_zero = '\0';
    fVar3.flush_inputs_to_zero = '\0';
    fVar3.default_nan_mode = '\0';
    fVar3.snan_bit_is_one = '\0';
    s.float_detect_tininess = '\x04';
    s.float_rounding_mode = '\0';
    s.float_exception_flags = '\0';
    s.floatx80_rounding_precision = '\0';
    s.flush_to_zero = '\0';
    s.flush_inputs_to_zero = '\0';
    s.default_nan_mode = '\0';
    s.snan_bit_is_one = '\0';
  }
  else {
    if (0x7ff0000000000000 < uVar2) {
      s.float_detect_tininess = '\0';
      s.float_rounding_mode = '\0';
      s.float_exception_flags = '\0';
      s.floatx80_rounding_precision = '\0';
      s.flush_to_zero = '\0';
      s.flush_inputs_to_zero = '\0';
      s.default_nan_mode = '\0';
      s.snan_bit_is_one = '\0';
      iVar1 = float64_is_quiet_nan_riscv64(frs1,&s);
      return (ulong)(iVar1 != 0) * 0x100 + 0x100;
    }
    fVar3.float_detect_tininess = '@';
    fVar3.float_rounding_mode = '\0';
    fVar3.float_exception_flags = '\0';
    fVar3.floatx80_rounding_precision = '\0';
    fVar3.flush_to_zero = '\0';
    fVar3.flush_inputs_to_zero = '\0';
    fVar3.default_nan_mode = '\0';
    fVar3.snan_bit_is_one = '\0';
    s.float_detect_tininess = '\x02';
    s.float_rounding_mode = '\0';
    s.float_exception_flags = '\0';
    s.floatx80_rounding_precision = '\0';
    s.flush_to_zero = '\0';
    s.flush_inputs_to_zero = '\0';
    s.default_nan_mode = '\0';
    s.snan_bit_is_one = '\0';
  }
  if (-1 < (long)frs1) {
    s = fVar3;
  }
  return (target_ulong)s;
}

Assistant:

target_ulong helper_fclass_d(uint64_t frs1)
{
    float64 f = frs1;
    bool sign = float64_is_neg(f);

    if (float64_is_infinity(f)) {
        return sign ? 1 << 0 : 1 << 7;
    } else if (float64_is_zero(f)) {
        return sign ? 1 << 3 : 1 << 4;
    } else if (float64_is_zero_or_denormal(f)) {
        return sign ? 1 << 2 : 1 << 5;
    } else if (float64_is_any_nan(f)) {
        float_status s = { 0 }; /* for snan_bit_is_one */
        return float64_is_quiet_nan(f, &s) ? 1 << 9 : 1 << 8;
    } else {
        return sign ? 1 << 1 : 1 << 6;
    }
}